

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

AsyncCapabilityStream *
kj::downcast<kj::AsyncCapabilityStream,kj::AsyncIoStream>(AsyncIoStream *from)

{
  long local_20;
  AsyncIoStream *from_local;
  
  if (from == (AsyncIoStream *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = __dynamic_cast(from,&AsyncIoStream::typeinfo,&AsyncCapabilityStream::typeinfo,0);
  }
  if (local_20 != 0) {
    return (AsyncCapabilityStream *)from;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common.h"
             ,0x863,"dynamic_cast<To*>(&from) != nullptr",
             "\"Value cannot be downcast() to requested type.\"",
             "Value cannot be downcast() to requested type.");
}

Assistant:

To& downcast(From& from) {
  // Down-cast a value to a sub-type, asserting that the cast is valid.  In opt mode this is a
  // static_cast, but in debug mode (when RTTI is enabled) a dynamic_cast will be used to verify
  // that the value really has the requested type.

  // Force a compile error if To is not a subtype of From.
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if !KJ_NO_RTTI
  KJ_IREQUIRE(dynamic_cast<To*>(&from) != nullptr, "Value cannot be downcast() to requested type.");
#endif

  return static_cast<To&>(from);
}